

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver-c.cc
# Opt level: O2

void __thiscall
mp::NLW2_NLFeeder_C_Impl::
FeedInitialGuesses<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::SingleSparseVecWrtFactory<int,double>>
          (NLW2_NLFeeder_C_Impl *this,SingleSparseVecWrtFactory<int,_double> *igw)

{
  int iVar1;
  SparseVectorWriter<int,_double> ig;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  iVar1 = (*(this->nlf2_c_).InitialGuessesNNZ)((this->nlf2_c_).p_user_data_);
  if (iVar1 != 0) {
    NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::
    SingleSparseVecWrtFactory<int,_double>::MakeVectorWriter
              ((SingleSparseVecWrtFactory<int,_double> *)&stack0xffffffffffffffd8,(size_t)igw);
    local_48._8_8_ = 0;
    local_30 = std::
               _Function_handler<void_(int,_double),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/src/nl-solver-c.cc:854:11)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(int,_double),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/src/nl-solver-c.cc:854:11)>
               ::_M_manager;
    local_48._M_unused._M_object =
         (SingleSparseVecWrtFactory<int,_double> *)&stack0xffffffffffffffd8;
    (*(this->nlf2_c_).FeedInitialGuesses)((this->nlf2_c_).p_user_data_,&local_48);
    std::_Function_base::~_Function_base((_Function_base *)&local_48);
  }
  return;
}

Assistant:

void mp::NLW2_NLFeeder_C_Impl::FeedInitialGuesses(IGWriter& igw) {
  assert(NLF().InitialGuessesNNZ);
  if (int nnz = NLF().InitialGuessesNNZ(NLF().p_user_data_)) {
    assert(NLF().FeedInitialGuesses);
    auto ig = igw.MakeVectorWriter(nnz);
    std::function<void(int, double)> wrt
        = [&ig](int i, double v){
      ig.Write(i, v);
    };
    NLF().FeedInitialGuesses(NLF().p_user_data_, &wrt);
  }
}